

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O2

REF_STATUS ref_mpi_allgather(REF_MPI ref_mpi,void *scalar,void *array,REF_TYPE type)

{
  if (type == 3) {
    *(undefined8 *)array = *scalar;
  }
  else if (type == 2) {
    *(undefined8 *)array = *scalar;
  }
  else {
    if (type != 1) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x387,
             "ref_mpi_allgather",6,"data type");
      return 6;
    }
    *(undefined4 *)array = *scalar;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_allgather(REF_MPI ref_mpi, void *scalar, void *array,
                                     REF_TYPE type) {
#ifdef HAVE_MPI
  MPI_Datatype datatype;

  if (!ref_mpi_para(ref_mpi)) {
    switch (type) {
      case REF_INT_TYPE:
        *(REF_INT *)array = *(REF_INT *)scalar;
        break;
      case REF_LONG_TYPE:
        *(REF_LONG *)array = *(REF_LONG *)scalar;
        break;
      case REF_DBL_TYPE:
        *(REF_DBL *)array = *(REF_DBL *)scalar;
        break;
      default:
        RSS(REF_IMPLEMENT, "data type");
    }
    return REF_SUCCESS;
  }

  ref_type_mpi_type(type, datatype);

  MPI_Allgather(scalar, 1, datatype, array, 1, datatype, ref_mpi_comm(ref_mpi));

#else
  switch (type) {
    case REF_INT_TYPE:
      *(REF_INT *)array = *(REF_INT *)scalar;
      break;
    case REF_LONG_TYPE:
      *(REF_LONG *)array = *(REF_LONG *)scalar;
      break;
    case REF_DBL_TYPE:
      *(REF_DBL *)array = *(REF_DBL *)scalar;
      break;
    default:
      RSS(REF_IMPLEMENT, "data type");
  }
  SUPRESS_UNUSED_COMPILER_WARNING(ref_mpi);
  SUPRESS_UNUSED_COMPILER_WARNING(type);
#endif

  return REF_SUCCESS;
}